

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::DateImplementation::GetString
          (DateImplementation *this,DateStringFormat dsf,ScriptContext *requestContext,
          DateTimeFlag noDateTime)

{
  _E _Var1;
  BOOL BVar2;
  JavascriptLibrary *this_00;
  ScriptContext *requestContext_local;
  DateImplementation *this_local;
  DateTimeFlag noDateTime_local;
  JavascriptString *pJStack_10;
  DateStringFormat dsf_local;
  
  this_local._6_1_ = noDateTime._value;
  this_local._7_1_ = dsf._value;
  BVar2 = JavascriptNumber::IsNan(this->m_tvUtc);
  if (BVar2 == 0) {
    _Var1 = DateStringFormat::operator_cast_to__E((DateStringFormat *)((long)&this_local + 7));
    if (_Var1 == GMT) {
      EnsureYmdUtc(this);
      pJStack_10 = GetDateGmtString(&this->m_ymdUtc,requestContext);
    }
    else {
      EnsureYmdLcl<Js::ScriptContext>(this,requestContext);
      pJStack_10 = GetDateDefaultString
                             (&this->m_ymdLcl,&this->m_tzd,this_local._6_1_,requestContext);
    }
  }
  else {
    this_00 = ScriptContext::GetLibrary(requestContext);
    pJStack_10 = JavascriptLibrary::GetInvalidDateString(this_00);
  }
  return pJStack_10;
}

Assistant:

JavascriptString*
    DateImplementation::GetString(DateStringFormat dsf,
        ScriptContext* requestContext, DateTimeFlag noDateTime)
    {
        if (JavascriptNumber::IsNan(m_tvUtc))
        {
            return requestContext->GetLibrary()->GetInvalidDateString();
        }

        switch (dsf)
         {
            default:
                EnsureYmdLcl(requestContext);
                return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);

#ifdef ENABLE_GLOBALIZATION
            case DateStringFormat::Locale:
                EnsureYmdLcl(requestContext);

                if( m_ymdLcl.year > 1600 && m_ymdLcl.year < 10000 )
                {
                    // The year falls in the range which can be handled by both the Win32
                    // function GetDateFormat and the COM+ date type
                    // - the latter is for forward compatibility with JS 7.
                    JavascriptString *bs = GetDateLocaleString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    if (bs != nullptr)
                    {
                        return bs;
                    }
                    else
                    {
                        return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    }
                }
                else
                {
                    return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                }
#endif

            case DateStringFormat::GMT:
                EnsureYmdUtc();
                return GetDateGmtString(&m_ymdUtc, requestContext);
        }
    }